

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int ar_equation_system_solve(aom_noise_state_t *state,int is_chroma)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  iVar3 = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (iVar3 != 0) {
    iVar1 = (state->eqns).n;
    uVar5 = iVar1 - is_chroma;
    iVar6 = 0;
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = (ulong)uVar5;
    }
    dVar10 = 0.0;
    uVar8 = uVar4;
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      dVar10 = dVar10 + (state->eqns).A[iVar6] / (double)state->num_observations;
      iVar6 = iVar6 + iVar1 + 1;
    }
    dVar11 = 0.0;
    lVar7 = (long)(iVar1 + -1);
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      pdVar2 = (state->eqns).x;
      dVar12 = (state->eqns).b[uVar8];
      if (is_chroma != 0) {
        dVar12 = dVar12 - (state->eqns).A[lVar7] * pdVar2[iVar1 + -1];
      }
      dVar11 = dVar11 + (dVar12 * pdVar2[uVar8]) / (double)state->num_observations;
      lVar7 = lVar7 + iVar1;
    }
    dVar11 = dVar10 / (double)(int)uVar5 - dVar11;
    if (dVar11 <= 1e-06) {
      dVar11 = 1e-06;
    }
    dVar11 = (dVar10 / (double)(int)uVar5) / dVar11;
    if (dVar11 <= 1e-06) {
      dVar11 = 1e-06;
    }
    dVar10 = 1.0;
    if (1.0 <= SQRT(dVar11)) {
      dVar10 = SQRT(dVar11);
    }
    state->ar_gain = dVar10;
  }
  return iVar3;
}

Assistant:

static int ar_equation_system_solve(aom_noise_state_t *state, int is_chroma) {
  const int ret = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (!ret) return ret;

  // Update the AR gain from the equation system as it will be used to fit
  // the noise strength as a function of intensity.  In the Yule-Walker
  // equations, the diagonal should be the variance of the correlated noise.
  // In the case of the least squares estimate, there will be some variability
  // in the diagonal. So use the mean of the diagonal as the estimate of
  // overall variance (this works for least squares or Yule-Walker formulation).
  double var = 0;
  const int n = state->eqns.n;
  for (int i = 0; i < (state->eqns.n - is_chroma); ++i) {
    var += state->eqns.A[i * n + i] / state->num_observations;
  }
  var /= (n - is_chroma);

  // Keep track of E(Y^2) = <b, x> + E(X^2)
  // In the case that we are using chroma and have an estimate of correlation
  // with luma we adjust that estimate slightly to remove the correlated bits by
  // subtracting out the last column of a scaled by our correlation estimate
  // from b. E(y^2) = <b - A(:, end)*x(end), x>
  double sum_covar = 0;
  for (int i = 0; i < state->eqns.n - is_chroma; ++i) {
    double bi = state->eqns.b[i];
    if (is_chroma) {
      bi -= state->eqns.A[i * n + (n - 1)] * state->eqns.x[n - 1];
    }
    sum_covar += (bi * state->eqns.x[i]) / state->num_observations;
  }
  // Now, get an estimate of the variance of uncorrelated noise signal and use
  // it to determine the gain of the AR filter.
  const double noise_var = AOMMAX(var - sum_covar, 1e-6);
  state->ar_gain = AOMMAX(1, sqrt(AOMMAX(var / noise_var, 1e-6)));
  return ret;
}